

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlParseCharData(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_40;
  undefined4 local_34;
  undefined *puStack_30;
  int cdata;
  PyObject *pyobj_ctxt;
  xmlParserCtxtPtr ctxt;
  PyObject *args_local;
  PyObject *self_local;
  
  ctxt = (xmlParserCtxtPtr)args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("xmlParseCharData");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT(ctxt,"Oi:xmlParseCharData",&stack0xffffffffffffffd0,&local_34);
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      if (puStack_30 == &_Py_NoneStruct) {
        local_40 = (PyObject *)0x0;
      }
      else {
        local_40 = *(PyObject **)(puStack_30 + 0x10);
      }
      pyobj_ctxt = local_40;
      xmlParseCharData(local_40,local_34);
      _Py_INCREF((PyObject *)&_Py_NoneStruct);
      self_local = (PyObject *)&_Py_NoneStruct;
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlParseCharData(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    xmlParserCtxtPtr ctxt;
    PyObject *pyobj_ctxt;
    int cdata;

    if (libxml_deprecationWarning("xmlParseCharData") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"Oi:xmlParseCharData", &pyobj_ctxt, &cdata))
        return(NULL);
    ctxt = (xmlParserCtxtPtr) PyparserCtxt_Get(pyobj_ctxt);

    xmlParseCharData(ctxt, cdata);
    Py_INCREF(Py_None);
    return(Py_None);
}